

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O0

void __thiscall QXmlStreamWriter::writeCDATA(QXmlStreamWriter *this,QAnyStringView text)

{
  bool bVar1;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 this_00;
  qsizetype qVar2;
  char *str;
  QAnyStringView *this_01;
  char *in_RCX;
  void *in_RDX;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 in_RSI;
  long in_FS_OFFSET;
  QLatin1StringView QVar3;
  QAnyStringView QVar4;
  qsizetype idx;
  QXmlStreamWriterPrivate *d;
  QAnyStringView *in_stack_fffffffffffffeb8;
  size_t in_stack_fffffffffffffec0;
  int *len;
  char *in_stack_fffffffffffffec8;
  QAnyStringView *in_stack_fffffffffffffed0;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 in_stack_fffffffffffffed8;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 in_stack_fffffffffffffee0;
  undefined1 *in_stack_fffffffffffffee8;
  undefined8 in_stack_fffffffffffffef8;
  undefined1 contents;
  QXmlStreamWriterPrivate *in_stack_ffffffffffffff00;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 this_02;
  void *local_d8;
  char *local_c8;
  int local_78 [2];
  void *local_70;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_68;
  void *pvStack_60;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_58;
  void *local_50;
  undefined1 local_48 [8];
  void *local_40;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_38;
  void *local_30;
  int local_28;
  void *local_20;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_18;
  void *pvStack_10;
  long local_8;
  
  contents = (undefined1)((ulong)in_stack_fffffffffffffef8 >> 0x38);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = in_RSI;
  pvStack_10 = in_RDX;
  this_00.m_data = d_func((QXmlStreamWriter *)0x64ed11);
  QXmlStreamWriterPrivate::finishStartElement(in_stack_ffffffffffffff00,(bool)contents);
  this_02.m_data = this_00.m_data;
  std::data<char_const,10ul>((char (*) [10])"<![CDATA[");
  QtPrivate::lengthHelperContainer<char,10ul>((char (*) [10])0x64ed83);
  QAnyStringView::QAnyStringView<char,_true>
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  QXmlStreamWriterPrivate::write
            ((QXmlStreamWriterPrivate *)this_02.m_data,local_28,local_20,(size_t)in_RCX);
  while( true ) {
    bVar1 = QAnyStringView::isEmpty((QAnyStringView *)0x64edd1);
    local_c8 = in_RCX;
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_38 = local_18;
    local_30 = pvStack_10;
    QVar3 = Qt::Literals::StringLiterals::operator____L1
                      (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    local_c8 = QVar3.m_data;
    QVar4.m_size = (size_t)in_stack_fffffffffffffee8;
    QVar4.field_0.m_data = in_stack_fffffffffffffee0.m_data;
    QVar3.m_data = in_stack_fffffffffffffed8.m_data_utf8;
    QVar3.m_size = (qsizetype)in_stack_fffffffffffffed0;
    qVar2 = anon_unknown.dwarf_d15ee3::indexOf(QVar4,QVar3);
    if (qVar2 < 0) break;
    in_stack_fffffffffffffed8.m_data = this_00.m_data;
    QVar4 = QAnyStringView::first(in_stack_fffffffffffffeb8,0x64ee76);
    local_d8 = (void *)QVar4.m_size;
    QXmlStreamWriterPrivate::write
              ((QXmlStreamWriterPrivate *)in_stack_fffffffffffffed8.m_data,QVar4.field_0._0_4_,
               local_d8,(size_t)local_c8);
    in_stack_fffffffffffffee8 = local_48;
    in_stack_fffffffffffffee0.m_data = this_00.m_data;
    std::data<char_const,16ul>((char (*) [16])"]]]]><![CDATA[>");
    QtPrivate::lengthHelperContainer<char,16ul>((char (*) [16])0x64eeec);
    QAnyStringView::QAnyStringView<char,_true>
              (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    QXmlStreamWriterPrivate::write
              ((QXmlStreamWriterPrivate *)in_stack_fffffffffffffee0.m_data,local_48._0_4_,local_40,
               (size_t)local_c8);
    _local_58 = QAnyStringView::sliced
                          ((QAnyStringView *)in_stack_fffffffffffffee0.m_data,
                           (qsizetype)in_stack_fffffffffffffed8);
    local_18 = local_58;
    pvStack_10 = local_50;
    in_RCX = local_c8;
  }
  local_68 = local_18;
  pvStack_60 = pvStack_10;
  QXmlStreamWriterPrivate::write
            ((QXmlStreamWriterPrivate *)this_00.m_data,local_18._0_4_,pvStack_10,(size_t)local_c8);
  len = local_78;
  str = std::data<char_const,4ul>((char (*) [4])"]]>");
  this_01 = (QAnyStringView *)QtPrivate::lengthHelperContainer<char,4ul>((char (*) [4])0x64efff);
  QAnyStringView::QAnyStringView<char,_true>(this_01,str,(qsizetype)len);
  QXmlStreamWriterPrivate::write
            ((QXmlStreamWriterPrivate *)this_00.m_data,local_78[0],local_70,(size_t)local_c8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QXmlStreamWriter::writeCDATA(QAnyStringView text)
{
    Q_D(QXmlStreamWriter);
    d->finishStartElement();
    d->write("<![CDATA[");
    while (!text.isEmpty()) {
        const auto idx = indexOf(text, "]]>"_L1);
        if (idx < 0)
            break;                   // no forbidden sequence found
        d->write(text.first(idx));
        d->write("]]"                // text[idx, idx + 2)
                 "]]><![CDATA["      // escape sequence to separate ]] and >
                 ">");               // text[idx + 2, idx + 3)
        text = text.sliced(idx + 3); // skip over "]]>"
    }
    d->write(text); // write remainder
    d->write("]]>");
}